

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# https.c
# Opt level: O3

int https_write(HTTP_INFO *hi,char *buffer,int len)

{
  uint uVar1;
  uint uVar2;
  
  uVar2 = 0;
  printf("11111111https_write %s \n");
  do {
    do {
      if ((hi->url).https == '\x01') {
        uVar1 = mbedtls_ssl_write(&(hi->tls).ssl,(uchar *)(buffer + uVar2),(long)(int)(len - uVar2))
        ;
      }
      else {
        uVar1 = mbedtls_net_send(&(hi->tls).ssl_fd,(uchar *)(buffer + uVar2),
                                 (long)(int)(len - uVar2));
      }
    } while (uVar1 == 0xffff9780);
  } while ((0 < (int)uVar1) && (uVar2 = uVar2 + uVar1, uVar1 = uVar2, (int)uVar2 < len));
  return uVar1;
}

Assistant:

static int https_write(HTTP_INFO *hi, char *buffer, int len)
{
    printf("11111111https_write %s \n", buffer);
    int ret, slen = 0;

    while(1)
    {
        if(hi->url.https == 1)
            ret = mbedtls_ssl_write(&hi->tls.ssl, (u_char *)&buffer[slen], (size_t)(len-slen));
        else
            ret = mbedtls_net_send(&hi->tls.ssl_fd, (u_char *)&buffer[slen], (size_t)(len-slen));

        if(ret == MBEDTLS_ERR_SSL_WANT_WRITE) continue;
        else if(ret <= 0) return ret;

        slen += ret;

        if(slen >= len) break;
    }

    return slen;
}